

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlesystem.cpp
# Opt level: O3

int battle(warrior *Warrior,zombie *Zombie)

{
  bool bVar1;
  int iVar2;
  warriorTypes wVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  char selection;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_15fb0,0xcaf);
  bVar1 = warrior::isAlive(Warrior);
  if (bVar1) {
    do {
      bVar1 = zombie::isKO(Zombie);
      if (bVar1) break;
      (**Warrior->_vptr_warrior)(Warrior);
      zombie::printInfo(Zombie,1);
      (*Warrior->_vptr_warrior[1])(Warrior);
      std::operator>>((istream *)&std::cin,(char *)((long)&uStack_28 + 7));
      playerAttack(uStack_28._7_1_,Warrior,Zombie);
      bVar1 = zombie::isKO(Zombie);
      if (bVar1) break;
      zombie::printInfo(Zombie,2);
      iVar2 = zombie::getDmg(Zombie);
      warrior::takeDamage(Warrior,iVar2);
      bVar1 = warrior::isAlive(Warrior);
    } while (bVar1);
  }
  bVar1 = zombie::isKO(Zombie);
  if (bVar1) {
    zombie::printInfo(Zombie,3);
    (*Warrior->_vptr_warrior[4])(Warrior,Zombie);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Score: ",7);
    iVar2 = warrior::getScore(Warrior);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    iVar2 = 0;
  }
  else {
    warrior::isAlive(Warrior);
    wVar3 = warrior::getWarriorType(Warrior);
    if (wVar3 == CHICHONNE) {
      pcVar6 = "Chichonne ";
      lVar5 = 10;
    }
    else {
      pcVar6 = "Derek ";
      lVar5 = 6;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Has Been Defeated!\n",0x13);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int battle(warrior *Warrior, zombie *Zombie) {
    //function to perform the battle gameplay
    //returns 0 if player wins
    //returns 1 if zombie wins

    char selection;
    printMessage();
    while (Warrior->isAlive() && !Zombie->isKO()) {
        Warrior->verbosePrint();
        Zombie->printInfo(1);
        Warrior->printOptions();
        cin >> selection;
        playerAttack(selection, Warrior, Zombie);
        if (Zombie->isKO())
            break;
        Zombie->printInfo(2);
        Warrior->takeDamage(Zombie->getDmg());
    }
    if (Zombie->isKO()) {
        Zombie->printInfo(3);
        Warrior->addKill(Zombie);
        cout << "Score: " << Warrior->getScore() << "\n";
        return 0;
    }
    if (!Warrior->isAlive()) {
        (Warrior->getWarriorType() == CHICHONNE) ? cout << "Chichonne " : cout << "Derek ";
        cout << "Has Been Defeated!\n";
        return 1;
    }
}